

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::InsertionSort<unsigned_short>
               (unsigned_short *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  unsigned_short local_32 [4];
  unsigned_short item;
  
  p_Var1 = cvInfo->compareType;
  for (uVar5 = 1; uVar5 < length; uVar5 = uVar5 + 1) {
    local_32[0] = list[uVar5];
    uVar6 = (int)uVar5 - 1;
    uVar8 = 0;
    uVar4 = uVar5 & 0xffffffff;
    while( true ) {
      bVar2 = (*p_Var1)(cvInfo,local_32,list + uVar6);
      if (bVar2) {
        uVar4 = (ulong)uVar6;
      }
      else {
        uVar8 = (ulong)(uVar6 + 1);
        uVar6 = (uint)uVar4;
      }
      uVar7 = (uint)uVar8;
      uVar3 = uVar5;
      if (uVar6 < uVar7 || uVar6 - uVar7 == 0) break;
      uVar6 = (uVar6 - uVar7 >> 1) + uVar7;
    }
    while (uVar8 < uVar3) {
      list[uVar3] = list[uVar3 - 1 & 0xffffffff];
      uVar3 = uVar3 - 1;
    }
    list[uVar8] = local_32[0];
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }